

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_GetState(FACTWaveBank *pWaveBank,uint32_t *pdwState)

{
  uint *in_RSI;
  long in_RDI;
  uint32_t i;
  uint local_1c;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    *in_RSI = 0;
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x1150a2);
    *in_RSI = 4;
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x30); local_1c = local_1c + 1) {
      if (*(int *)(*(long *)(in_RDI + 0x40) + (ulong)local_1c * 4) != 0) {
        *in_RSI = *in_RSI | 0x80;
        FAudio_PlatformUnlockMutex((FAudioMutex)0x1150f9);
        return 0;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x115126);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_GetState(
	FACTWaveBank *pWaveBank,
	uint32_t *pdwState
) {
	uint32_t i;
	if (pWaveBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pWaveBank->entryCount; i += 1)
	{
		if (pWaveBank->entryRefs[i] > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pWaveBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}